

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O2

wchar_t count_known_monsters(void)

{
  monster_base **ppmVar1;
  wchar_t wVar2;
  monster_race *pmVar3;
  monster_race *pmVar4;
  _Bool _Var5;
  wchar_t wVar6;
  wchar_t wVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  byte bVar12;
  
  uVar10 = 0;
  wVar7 = L'\0';
  do {
    pmVar4 = r_info;
    if (z_info->r_max <= uVar10) {
      return wVar7;
    }
    if (((l_list[uVar10].all_known != false) || (l_list[uVar10].sights != 0)) &&
       (r_info[uVar10].name != (char *)0x0)) {
      pmVar3 = r_info + uVar10;
      bVar12 = 0;
      wVar6 = n_monster_group;
      for (lVar11 = 0; lVar11 < wVar6 + L'\xffffffff'; lVar11 = lVar11 + 1) {
        wVar2 = monster_group[lVar11].n_inc_bases;
        if (wVar2 == L'\0') {
LAB_001c8691:
          _Var5 = flag_is_inter(pmVar3->flags,monster_group[lVar11].inc_flags,0xb);
          wVar7 = wVar7 + (uint)_Var5;
          wVar6 = n_monster_group;
          if (_Var5) {
            bVar12 = 1;
          }
        }
        else {
          uVar8 = (ulong)(uint)wVar2;
          if (wVar2 < L'\x01') {
            uVar8 = 0;
          }
          uVar9 = 0;
          do {
            if (uVar8 == uVar9) goto LAB_001c8691;
            ppmVar1 = monster_group[lVar11].inc_bases + uVar9;
            uVar9 = uVar9 + 1;
          } while (pmVar4[uVar10].base != *ppmVar1);
          wVar7 = wVar7 + L'\x01';
          bVar12 = 1;
        }
      }
      wVar7 = wVar7 + (uint)(~bVar12 & 1);
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

static int count_known_monsters(void)
{
	int m_count = 0, i;

	for (i = 0; i < z_info->r_max; ++i) {
		struct monster_race *race = &r_info[i];
		bool classified = false;
		int j;

		if (!l_list[i].all_known && !l_list[i].sights) {
			continue;
		}
		if (!race->name) continue;

		for (j = 0; j < n_monster_group - 1; ++j) {
			bool has_base = false;

			if (monster_group[j].n_inc_bases) {
				int k;

				for (k = 0; k < monster_group[j].n_inc_bases;
						++k) {
					if (race->base == monster_group[j].inc_bases[k]) {
						++m_count;
						has_base = true;
						classified = true;
						break;
					}
				}
			}
			if (!has_base && rf_is_inter(race->flags,
					monster_group[j].inc_flags)) {
				++m_count;
				classified = true;
			}
		}

		if (!classified) {
			++m_count;
		}
	}

	return m_count;
}